

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

void __thiscall
sqlite_orm::internal::storage_base::foreign_keys(storage_base *this,sqlite3 *db,bool value)

{
  int __v;
  ostream *this_00;
  undefined8 uVar1;
  error_category *__cat;
  byte in_DL;
  undefined8 in_RSI;
  int rc;
  __string_type query;
  stringstream ss;
  error_code local_1e8;
  int local_1d4;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  char *in_stack_fffffffffffffe68;
  system_error *in_stack_fffffffffffffe70;
  error_code in_stack_fffffffffffffe78;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  this_00 = std::operator<<((ostream *)&stack0xfffffffffffffe70,"PRAGMA foreign_keys = ");
  std::ostream::operator<<(this_00,(bool)(in_DL & 1));
  std::__cxx11::stringstream::str();
  uVar1 = std::__cxx11::string::c_str();
  local_1d4 = sqlite3_exec(in_RSI,uVar1,0,0);
  if (local_1d4 != 0) {
    uVar1 = __cxa_allocate_exception(0x20);
    __v = sqlite3_errcode(in_RSI);
    __cat = &get_sqlite_error_category()->super_error_category;
    std::error_code::error_code(&local_1e8,__v,__cat);
    sqlite3_errmsg(in_RSI);
    std::system_error::system_error
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,in_stack_fffffffffffffe68);
    __cxa_throw(uVar1,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void foreign_keys(sqlite3 *db, bool value) {
        std::stringstream ss;
        ss << "PRAGMA foreign_keys = " << value;
        auto query = ss.str();
        auto rc = sqlite3_exec(db, query.c_str(), nullptr, nullptr, nullptr);
        if(rc != SQLITE_OK) {
            throw std::system_error(std::error_code(sqlite3_errcode(db), get_sqlite_error_category()),
                                    sqlite3_errmsg(db));
        }
    }